

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall List::draw(List *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  Theme *pTVar9;
  size_type sVar10;
  undefined8 uVar11;
  long *in_RDI;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  int yi;
  uint i;
  int font_height;
  ALLEGRO_COLOR bg;
  SaveState state;
  Theme *theme;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  SaveState *in_stack_fffffffffffffb20;
  ALLEGRO_FONT *this_00;
  uint local_460;
  undefined4 local_428;
  undefined8 uStack_420;
  
  pTVar9 = Dialog::get_theme((Dialog *)in_RDI[3]);
  anon_unknown.dwarf_97ec::SaveState::SaveState(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c)
  ;
  uVar4 = (pTVar9->bg).r;
  uStack_420._0_4_ = (pTVar9->bg).b;
  uStack_420._4_4_ = (pTVar9->bg).a;
  bVar6 = (**(code **)(*in_RDI + 0x80))();
  local_428 = uVar4;
  if ((bVar6 & 1) != 0) {
    local_428 = al_map_rgb(0x40,0x40);
    uStack_420 = CONCAT44(in_XMM1_Db,in_XMM1_Da);
  }
  al_draw_filled_rectangle
            ((float)((int)in_RDI[4] + 1),(float)(*(int *)((long)in_RDI + 0x24) + 1),
             (float)((int)in_RDI[5] + -1),(float)(*(int *)((long)in_RDI + 0x2c) + -1),local_428,
             uStack_420);
  al_set_blender(0,1,3);
  iVar7 = al_get_font_line_height(pTVar9->font);
  for (local_460 = 0;
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(in_RDI + 7)), local_460 < sVar10; local_460 = local_460 + 1) {
    iVar8 = *(int *)((long)in_RDI + 0x24) + local_460 * iVar7;
    if (local_460 == *(uint *)(in_RDI + 10)) {
      uVar1 = (pTVar9->highlight).r;
      uVar11._0_4_ = (pTVar9->highlight).b;
      uVar11._4_4_ = (pTVar9->highlight).a;
      al_draw_filled_rectangle
                ((float)((int)in_RDI[4] + 1),(float)iVar8,(float)((int)in_RDI[5] + -1),
                 (float)(iVar8 + -1 + iVar7),uVar1,uVar11);
    }
    this_00 = pTVar9->font;
    uVar2 = (pTVar9->fg).r;
    uVar3 = (pTVar9->fg).b;
    lVar5 = in_RDI[4];
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00,CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    uVar11 = std::__cxx11::string::c_str();
    al_draw_text(uVar2,uVar3,(float)(int)lVar5,(float)iVar8,this_00,0,uVar11);
  }
  anon_unknown.dwarf_97ec::SaveState::~SaveState((SaveState *)0x10ee1f);
  return;
}

Assistant:

void List::draw()
{
   const Theme & theme = dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1 + 1, y1 + 1, x2 - 1, y2 - 1, bg);

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   const int font_height = al_get_font_line_height(theme.font);
   for (unsigned i = 0; i < items.size(); i++) {
      int yi = y1 + i * font_height;

      if (i == selected_item) {
         al_draw_filled_rectangle(x1 + 1, yi, x2 - 1, yi + font_height - 1,
            theme.highlight);
      }

      al_draw_text(theme.font, theme.fg, x1, yi, 0, items.at(i).c_str());
   }
}